

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O0

void __thiscall
glu::sl::ShaderParser::parsePipelineProgram(ShaderParser *this,ProgramSpecification *program)

{
  deUint32 dVar1;
  char *str;
  allocator<char> local_129;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator<char> local_e1;
  string local_e0;
  string local_c0;
  undefined1 local_a0 [8];
  string source;
  Token token;
  undefined1 local_48 [8];
  CaseRequirement requirement;
  ProgramSpecification *program_local;
  ShaderParser *this_local;
  
  requirement.requiredCap = (RequiredCapability)program;
  advanceToken(this,TOKEN_PIPELINE_PROGRAM);
  while (this->m_curToken != TOKEN_END) {
    if (this->m_curToken == TOKEN_ACTIVE_STAGES) {
      advanceToken(this);
      dVar1 = parseShaderStageList(this);
      *(deUint32 *)((long)requirement.requiredCap + 0xe8) = dVar1;
    }
    else if (this->m_curToken == TOKEN_REQUIRE) {
      CaseRequirement::CaseRequirement((CaseRequirement *)local_48);
      parseRequirement(this,(CaseRequirement *)local_48);
      if (local_48._0_4_ == TYPE_EXTENSION) {
        std::vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_>::
        push_back((vector<glu::sl::RequiredExtension,_std::allocator<glu::sl::RequiredExtension>_> *
                  )((long)requirement.requiredCap + 0xd0),(value_type *)&requirement);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&token,
                   "only extension requirements are allowed inside pipeline program",
                   (allocator<char> *)(source.field_2._M_local_buf + 0xf));
        parseError(this,(string *)&token);
        std::__cxx11::string::~string((string *)&token);
        std::allocator<char>::~allocator((allocator<char> *)(source.field_2._M_local_buf + 0xf));
      }
      CaseRequirement::~CaseRequirement((CaseRequirement *)local_48);
    }
    else if ((((this->m_curToken == TOKEN_VERTEX) || (this->m_curToken == TOKEN_FRAGMENT)) ||
             (this->m_curToken == TOKEN_TESSELLATION_CONTROL)) ||
            ((this->m_curToken == TOKEN_TESSELLATION_EVALUATION ||
             (this->m_curToken == TOKEN_GEOMETRY)))) {
      source.field_2._8_4_ = this->m_curToken;
      std::__cxx11::string::string((string *)local_a0);
      advanceToken(this);
      assumeToken(this,TOKEN_SHADER_SOURCE);
      str = (char *)std::__cxx11::string::c_str();
      parseShaderSource_abi_cxx11_(&local_c0,this,str);
      std::__cxx11::string::operator=((string *)local_a0,(string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_c0);
      advanceToken(this);
      switch(source.field_2._8_4_) {
      case 0x10:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)requirement.requiredCap,(value_type *)local_a0);
        break;
      case 0x11:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)requirement.requiredCap + 0x18),(value_type *)local_a0);
        break;
      default:
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_e0,(char *)0x0,&local_e1);
        parseError(this,&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        std::allocator<char>::~allocator(&local_e1);
        break;
      case 0x2f:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)requirement.requiredCap + 0x48),(value_type *)local_a0);
        break;
      case 0x30:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)requirement.requiredCap + 0x60),(value_type *)local_a0);
        break;
      case 0x31:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)requirement.requiredCap + 0x30),(value_type *)local_a0);
      }
      std::__cxx11::string::~string((string *)local_a0);
    }
    else {
      std::operator+(&local_108,"invalid pipeline program value: ",&this->m_curTokenStr);
      parseError(this,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
    }
  }
  advanceToken(this,TOKEN_END);
  if (*(int *)((long)requirement.requiredCap + 0xe8) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"program pipeline object must have active stages",&local_129);
    parseError(this,&local_128);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  return;
}

Assistant:

void ShaderParser::parsePipelineProgram (ProgramSpecification& program)
{
	advanceToken(TOKEN_PIPELINE_PROGRAM);

	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_ACTIVE_STAGES)
		{
			advanceToken();
			program.activeStages = parseShaderStageList();
		}
		else if (m_curToken == TOKEN_REQUIRE)
		{
			CaseRequirement requirement;
			parseRequirement(requirement);

			if (requirement.type == CaseRequirement::TYPE_EXTENSION)
				program.requiredExtensions.push_back(requirement.extension);
			else
				parseError("only extension requirements are allowed inside pipeline program");
		}
		else if (m_curToken == TOKEN_VERTEX						||
				 m_curToken == TOKEN_FRAGMENT					||
				 m_curToken == TOKEN_TESSELLATION_CONTROL		||
				 m_curToken == TOKEN_TESSELLATION_EVALUATION	||
				 m_curToken == TOKEN_GEOMETRY)
		{
			const Token	token = m_curToken;
			string		source;

			advanceToken();
			assumeToken(TOKEN_SHADER_SOURCE);
			source = parseShaderSource(m_curTokenStr.c_str());
			advanceToken();

			switch (token)
			{
				case TOKEN_VERTEX:					program.sources.sources[SHADERTYPE_VERTEX].push_back(source);					break;
				case TOKEN_FRAGMENT:				program.sources.sources[SHADERTYPE_FRAGMENT].push_back(source);					break;
				case TOKEN_TESSELLATION_CONTROL:	program.sources.sources[SHADERTYPE_TESSELLATION_CONTROL].push_back(source);		break;
				case TOKEN_TESSELLATION_EVALUATION:	program.sources.sources[SHADERTYPE_TESSELLATION_EVALUATION].push_back(source);	break;
				case TOKEN_GEOMETRY:				program.sources.sources[SHADERTYPE_GEOMETRY].push_back(source);					break;
				default:
					parseError(DE_FALSE);
			}
		}
		else
			parseError(string("invalid pipeline program value: " + m_curTokenStr));
	}
	advanceToken(TOKEN_END);

	if (program.activeStages == 0)
		parseError("program pipeline object must have active stages");
}